

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistent_cohomology.h
# Opt level: O0

void __thiscall
Gudhi::persistent_cohomology::
Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_Gudhi::persistent_cohomology::Field_Zp>
::plus_equal_column(Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_Gudhi::persistent_cohomology::Field_Zp>
                    *this,Column *target,A_ds_type *other,Arith_element w)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  Element EVar4;
  pointer pPVar5;
  pointer ppVar6;
  pointer pPVar7;
  bool local_121;
  undefined1 local_118 [16];
  undefined1 local_108 [56];
  pointer local_d0;
  Cell *cell_tmp_1;
  list_impl<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_unsigned_long,_false,_void>
  local_c0;
  reference local_b0;
  Cell *tmp_cell_ptr;
  iterator tmp_it;
  undefined1 local_98 [72];
  pointer local_50;
  Cell *cell_tmp;
  list_impl<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_unsigned_long,_false,_void>
  local_40;
  const_iterator other_it;
  iterator target_it;
  Arith_element w_local;
  A_ds_type *other_local;
  Column *target_local;
  Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_Gudhi::persistent_cohomology::Field_Zp>
  *this_local;
  
  target_it.members_.nodeptr_._4_4_ = w;
  boost::intrusive::
  list_impl<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_unsigned_long,_false,_void>
  ::begin((list_impl<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_unsigned_long,_false,_void>
           *)&other_it);
  local_40.data_.root_plus_size_.m_header.super_node.prev_ =
       (node_ptr)
       std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>::
       begin(other);
  while( true ) {
    boost::intrusive::
    list_impl<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_unsigned_long,_false,_void>
    ::end(&local_40);
    bVar3 = boost::intrusive::operator!=
                      ((list_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_false>
                        *)&other_it,
                       (list_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_false>
                        *)&local_40);
    local_121 = false;
    if (bVar3) {
      cell_tmp = (Cell *)std::
                         vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
                         ::end(other);
      local_121 = __gnu_cxx::operator!=
                            ((__normal_iterator<const_std::pair<unsigned_int,_int>_*,_std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>_>
                              *)&local_40.data_.root_plus_size_.m_header.super_node.prev_,
                             (__normal_iterator<const_std::pair<unsigned_int,_int>_*,_std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>_>
                              *)&cell_tmp);
    }
    if (local_121 == false) break;
    pPVar5 = boost::intrusive::
             list_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_false>
             ::operator->((list_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_false>
                           *)&other_it);
    uVar2 = pPVar5->key_;
    ppVar6 = __gnu_cxx::
             __normal_iterator<const_std::pair<unsigned_int,_int>_*,_std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>_>
             ::operator->((__normal_iterator<const_std::pair<unsigned_int,_int>_*,_std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>_>
                           *)&local_40.data_.root_plus_size_.m_header.super_node.prev_);
    if (uVar2 < ppVar6->first) {
      boost::intrusive::
      list_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_false>
      ::operator++((list_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_false>
                    *)&other_it);
    }
    else {
      pPVar5 = boost::intrusive::
               list_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_false>
               ::operator->((list_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_false>
                             *)&other_it);
      uVar2 = pPVar5->key_;
      ppVar6 = __gnu_cxx::
               __normal_iterator<const_std::pair<unsigned_int,_int>_*,_std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>_>
               ::operator->((__normal_iterator<const_std::pair<unsigned_int,_int>_*,_std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>_>
                             *)&local_40.data_.root_plus_size_.m_header.super_node.prev_);
      if (ppVar6->first < uVar2) {
        ppVar6 = __gnu_cxx::
                 __normal_iterator<const_std::pair<unsigned_int,_int>_*,_std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>_>
                 ::operator->((__normal_iterator<const_std::pair<unsigned_int,_int>_*,_std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>_>
                               *)&local_40.data_.root_plus_size_.m_header.super_node.prev_);
        uVar2 = ppVar6->first;
        EVar4 = Field_Zp::additive_identity(&this->coeff_field_);
        Persistent_cohomology_cell<unsigned_int,_int>::Persistent_cohomology_cell
                  ((Persistent_cohomology_cell<unsigned_int,_int> *)(local_98 + 0x18),uVar2,EVar4,
                   target);
        pPVar7 = Simple_object_pool<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,int>>
                 ::
                 construct<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,int>>
                           ((Simple_object_pool<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,int>>
                             *)&this->cell_pool_,
                            (Persistent_cohomology_cell<unsigned_int,_int> *)(local_98 + 0x18));
        Persistent_cohomology_cell<unsigned_int,_int>::~Persistent_cohomology_cell
                  ((Persistent_cohomology_cell<unsigned_int,_int> *)(local_98 + 0x18));
        local_50 = pPVar7;
        ppVar6 = __gnu_cxx::
                 __normal_iterator<const_std::pair<unsigned_int,_int>_*,_std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>_>
                 ::operator->((__normal_iterator<const_std::pair<unsigned_int,_int>_*,_std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>_>
                               *)&local_40.data_.root_plus_size_.m_header.super_node.prev_);
        EVar4 = Field_Zp::plus_times_equal
                          (&this->coeff_field_,&pPVar7->coefficient_,&ppVar6->second,
                           (Element *)((long)&target_it.members_.nodeptr_ + 4));
        local_50->coefficient_ = EVar4;
        boost::intrusive::
        list_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_true>
        ::list_iterator((list_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_true>
                         *)local_98,(nonconst_iterator *)&other_it);
        boost::intrusive::
        list_impl<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_unsigned_long,_false,_void>
        ::insert((list_impl<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_unsigned_long,_false,_void>
                  *)&tmp_it,(const_iterator *)&target->col_,(reference)local_98);
        __gnu_cxx::
        __normal_iterator<const_std::pair<unsigned_int,_int>_*,_std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>_>
        ::operator++((__normal_iterator<const_std::pair<unsigned_int,_int>_*,_std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>_>
                      *)&local_40.data_.root_plus_size_.m_header.super_node.prev_);
      }
      else {
        pPVar5 = boost::intrusive::
                 list_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_false>
                 ::operator->((list_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_false>
                               *)&other_it);
        ppVar6 = __gnu_cxx::
                 __normal_iterator<const_std::pair<unsigned_int,_int>_*,_std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>_>
                 ::operator->((__normal_iterator<const_std::pair<unsigned_int,_int>_*,_std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>_>
                               *)&local_40.data_.root_plus_size_.m_header.super_node.prev_);
        EVar4 = Field_Zp::plus_times_equal
                          (&this->coeff_field_,&pPVar5->coefficient_,&ppVar6->second,
                           (Element *)((long)&target_it.members_.nodeptr_ + 4));
        pPVar5 = boost::intrusive::
                 list_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_false>
                 ::operator->((list_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_false>
                               *)&other_it);
        pPVar5->coefficient_ = EVar4;
        pPVar5 = boost::intrusive::
                 list_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_false>
                 ::operator->((list_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_false>
                               *)&other_it);
        iVar1 = pPVar5->coefficient_;
        EVar4 = Field_Zp::additive_identity(&this->coeff_field_);
        if (iVar1 == EVar4) {
          boost::intrusive::
          list_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_false>
          ::list_iterator((list_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_false>
                           *)&tmp_cell_ptr,
                          (list_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_false>
                           *)&other_it);
          boost::intrusive::
          list_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_false>
          ::operator++((list_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_false>
                        *)&other_it);
          __gnu_cxx::
          __normal_iterator<const_std::pair<unsigned_int,_int>_*,_std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>_>
          ::operator++((__normal_iterator<const_std::pair<unsigned_int,_int>_*,_std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>_>
                        *)&local_40.data_.root_plus_size_.m_header.super_node.prev_);
          local_b0 = boost::intrusive::
                     list_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_false>
                     ::operator*((list_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_false>
                                  *)&tmp_cell_ptr);
          boost::intrusive::
          list_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_true>
          ::list_iterator((list_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_true>
                           *)&local_c0.data_.root_plus_size_.m_header.super_node.prev_,
                          (nonconst_iterator *)&tmp_cell_ptr);
          boost::intrusive::
          list_impl<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_unsigned_long,_false,_void>
          ::erase(&local_c0,(const_iterator *)&target->col_);
          Simple_object_pool<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>_>
          ::destroy(&this->cell_pool_,local_b0);
        }
        else {
          boost::intrusive::
          list_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_false>
          ::operator++((list_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_false>
                        *)&other_it);
          __gnu_cxx::
          __normal_iterator<const_std::pair<unsigned_int,_int>_*,_std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>_>
          ::operator++((__normal_iterator<const_std::pair<unsigned_int,_int>_*,_std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>_>
                        *)&local_40.data_.root_plus_size_.m_header.super_node.prev_);
        }
      }
    }
  }
  while( true ) {
    cell_tmp_1 = (Cell *)std::
                         vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
                         ::end(other);
    bVar3 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::pair<unsigned_int,_int>_*,_std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>_>
                        *)&local_40.data_.root_plus_size_.m_header.super_node.prev_,
                       (__normal_iterator<const_std::pair<unsigned_int,_int>_*,_std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>_>
                        *)&cell_tmp_1);
    if (!bVar3) break;
    ppVar6 = __gnu_cxx::
             __normal_iterator<const_std::pair<unsigned_int,_int>_*,_std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>_>
             ::operator->((__normal_iterator<const_std::pair<unsigned_int,_int>_*,_std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>_>
                           *)&local_40.data_.root_plus_size_.m_header.super_node.prev_);
    uVar2 = ppVar6->first;
    EVar4 = Field_Zp::additive_identity(&this->coeff_field_);
    Persistent_cohomology_cell<unsigned_int,_int>::Persistent_cohomology_cell
              ((Persistent_cohomology_cell<unsigned_int,_int> *)(local_108 + 8),uVar2,EVar4,target);
    pPVar7 = Simple_object_pool<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,int>>
             ::construct<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,int>>
                       ((Simple_object_pool<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,int>>
                         *)&this->cell_pool_,
                        (Persistent_cohomology_cell<unsigned_int,_int> *)(local_108 + 8));
    Persistent_cohomology_cell<unsigned_int,_int>::~Persistent_cohomology_cell
              ((Persistent_cohomology_cell<unsigned_int,_int> *)(local_108 + 8));
    local_d0 = pPVar7;
    ppVar6 = __gnu_cxx::
             __normal_iterator<const_std::pair<unsigned_int,_int>_*,_std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>_>
             ::operator->((__normal_iterator<const_std::pair<unsigned_int,_int>_*,_std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>_>
                           *)&local_40.data_.root_plus_size_.m_header.super_node.prev_);
    EVar4 = Field_Zp::plus_times_equal
                      (&this->coeff_field_,&pPVar7->coefficient_,&ppVar6->second,
                       (Element *)((long)&target_it.members_.nodeptr_ + 4));
    local_d0->coefficient_ = EVar4;
    boost::intrusive::
    list_impl<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_unsigned_long,_false,_void>
    ::end((list_impl<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_unsigned_long,_false,_void>
           *)(local_118 + 8));
    boost::intrusive::
    list_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_true>
    ::list_iterator((list_iterator<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_true>
                     *)local_108,(nonconst_iterator *)(local_118 + 8));
    boost::intrusive::
    list_impl<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_unsigned_long,_false,_void>
    ::insert((list_impl<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)0,_Gudhi::persistent_cohomology::cam_v_tag,_1U>,_unsigned_long,_false,_void>
              *)local_118,(const_iterator *)&target->col_,(reference)local_108);
    __gnu_cxx::
    __normal_iterator<const_std::pair<unsigned_int,_int>_*,_std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>_>
    ::operator++((__normal_iterator<const_std::pair<unsigned_int,_int>_*,_std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>_>
                  *)&local_40.data_.root_plus_size_.m_header.super_node.prev_);
  }
  return;
}

Assistant:

void plus_equal_column(Column & target, A_ds_type const& other  // value_type is pair<Simplex_key,Arith_element>
                         , Arith_element w) {
    auto target_it = target.col_.begin();
    auto other_it = other.begin();
    while (target_it != target.col_.end() && other_it != other.end()) {
      if (target_it->key_ < other_it->first) {
        ++target_it;
      } else {
        if (target_it->key_ > other_it->first) {
          Cell * cell_tmp = cell_pool_.construct(Cell(other_it->first   // key
              , coeff_field_.additive_identity(), &target));

          cell_tmp->coefficient_ = coeff_field_.plus_times_equal(cell_tmp->coefficient_, other_it->second, w);

          target.col_.insert(target_it, *cell_tmp);

          ++other_it;
        } else {  // it1->key == it2->key
          // target_it->coefficient_ <- target_it->coefficient_ + other_it->second * w
          target_it->coefficient_ = coeff_field_.plus_times_equal(target_it->coefficient_, other_it->second, w);
          if (target_it->coefficient_ == coeff_field_.additive_identity()) {
            auto tmp_it = target_it;
            ++target_it;
            ++other_it;   // iterators remain valid
            Cell * tmp_cell_ptr = &(*tmp_it);
            target.col_.erase(tmp_it);  // removed from column

            cell_pool_.destroy(tmp_cell_ptr);  // delete from memory
          } else {
            ++target_it;
            ++other_it;
          }
        }
      }
    }
    while (other_it != other.end()) {
      Cell * cell_tmp = cell_pool_.construct(Cell(other_it->first, coeff_field_.additive_identity(), &target));
      cell_tmp->coefficient_ = coeff_field_.plus_times_equal(cell_tmp->coefficient_, other_it->second, w);
      target.col_.insert(target.col_.end(), *cell_tmp);

      ++other_it;
    }
  }